

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerBoundCheck(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  byte bVar3;
  undefined8 target;
  bool bVar4;
  OpndKind OVar5;
  uint uVar6;
  int32 iVar7;
  BailOutKind bailOutKindToLower;
  undefined4 *puVar8;
  LabelInstr *pLVar9;
  Lowerer *pLVar10;
  Lowerer *pLVar11;
  Lowerer *opnd;
  IntConstOpnd *pIVar12;
  char *pcVar13;
  char *pcVar14;
  undefined1 left [8];
  uint uVar15;
  Opnd *pOVar16;
  byte bVar17;
  undefined1 local_80 [8];
  AutoReuseOpnd autoReuseAddResultOpnd;
  Opnd *local_60;
  LabelInstr *local_50;
  Lowerer *local_40;
  OpCode local_32;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3577,"(instr)","instr");
    if (!bVar4) goto LAB_005bcf6e;
    *puVar8 = 0;
  }
  uVar6._0_2_ = instr->m_opcode;
  uVar6._2_1_ = instr->ignoreOverflowBitCount;
  uVar6._3_1_ = instr->dataWidth;
  if (1 < (ushort)((undefined2)uVar6 - 0x207)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3578,
                       "(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck)"
                       ,
                       "instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck"
                      );
    if (!bVar4) goto LAB_005bcf6e;
    *puVar8 = 0;
    uVar6 = (uint)instr->m_opcode;
  }
  if ((uVar6 & 0xffff) == 0x208) {
    OVar5 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x357f,"(instr->GetSrc1()->IsRegOpnd())","instr->GetSrc1()->IsRegOpnd()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
    if (instr->m_src1->m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3580,"(instr->GetSrc1()->IsInt32())","instr->GetSrc1()->IsInt32()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
    pOVar16 = instr->m_src2;
    if (pOVar16 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3581,"(instr->GetSrc2())","instr->GetSrc2()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
      pOVar16 = instr->m_src2;
    }
    OVar5 = IR::Opnd::GetKind(pOVar16);
    if (OVar5 == OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3582,"(!instr->GetSrc2()->IsIntConstOpnd())",
                         "!instr->GetSrc2()->IsIntConstOpnd()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
    pIVar12 = (IntConstOpnd *)instr->m_dst;
    if (pIVar12 != (IntConstOpnd *)0x0) {
      OVar5 = IR::Opnd::GetKind((Opnd *)pIVar12);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar4) goto LAB_005bcf6e;
        *puVar8 = 0;
      }
      iVar7 = IR::IntConstOpnd::AsInt32(pIVar12);
      if (1 < iVar7 + 1U) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3586,"(c == 0 || c == -1)","c == 0 || c == -1");
        if (!bVar4) goto LAB_005bcf6e;
        *puVar8 = 0;
      }
    }
  }
  bailOutKindToLower = IR::Instr::GetBailOutKind(instr);
  if (((1 < bailOutKindToLower - BailOutOnFailedHoistedBoundCheck) &&
      (bailOutKindToLower != BailOutOnArrayAccessHelperCall)) &&
     (bailOutKindToLower != BailOutOnInvalidatedArrayHeadSegment)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3590,
                       "(bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck)"
                       ,
                       "bailOutKind == IR::BailOutOnArrayAccessHelperCall || bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment || bailOutKind == IR::BailOutOnFailedHoistedBoundCheck || bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck"
                      );
    if (!bVar4) goto LAB_005bcf6e;
    *puVar8 = 0;
  }
  pLVar9 = IR::Instr::GetOrCreateContinueLabel(instr,false);
  LowerOneBailOutKind(this,instr,bailOutKindToLower,false,false);
  if ((instr->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3594,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar4) goto LAB_005bcf6e;
    *puVar8 = 0;
  }
  local_50 = (LabelInstr *)instr->m_next;
  local_40 = (Lowerer *)IR::Instr::UnlinkSrc1(instr);
  if (local_40 == (Lowerer *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar14 = "(isRightOpnd)";
    pcVar13 = "isRightOpnd";
    uVar15 = 0x359c;
LAB_005bc9f5:
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,uVar15,pcVar14,pcVar13);
    if (!bVar4) goto LAB_005bcf6e;
    *puVar8 = 0;
  }
  else {
    OVar5 = IR::Opnd::GetKind((Opnd *)local_40);
    if ((OVar5 != OpndKindIntConst) &&
       ((*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   &(local_40->m_lowererMD).FloatPrefThreshold + 1) | 4) != 7)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      pcVar14 = "(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32)";
      pcVar13 = "opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32";
      uVar15 = 0x35a4;
      goto LAB_005bc9f5;
    }
  }
  pLVar10 = (Lowerer *)IR::Instr::UnlinkSrc2(instr);
  pLVar11 = local_40;
  if (pLVar10 == (Lowerer *)0x0) {
LAB_005bcb51:
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
    if (OVar5 == OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x35ad,
                         "(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd())"
                         ,"!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd()"
                        );
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
  }
  else {
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar10);
    if (OVar5 == OpndKindIntConst) {
      OVar5 = IR::Opnd::GetKind((Opnd *)pLVar10);
      if (OVar5 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar4) goto LAB_005bcf6e;
        *puVar8 = 0;
      }
      if ((pLVar10->m_lowererMD).m_func == (Func *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        pcVar14 = "(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0)";
        pcVar13 = "!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0";
        uVar15 = 0x35a1;
LAB_005bcb2e:
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,uVar15,pcVar14,pcVar13);
        if (!bVar4) goto LAB_005bcf6e;
        *puVar8 = 0;
      }
    }
    else if ((*(byte *)((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(pLVar10->m_lowererMD).FloatPrefThreshold + 1) | 4) != 7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      pcVar14 = "(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32)";
      pcVar13 = "opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32";
      uVar15 = 0x35a4;
      goto LAB_005bcb2e;
    }
    OVar5 = IR::Opnd::GetKind((Opnd *)local_40);
    pLVar11 = pLVar10;
    if (OVar5 == OpndKindIntConst) goto LAB_005bcb51;
  }
  pOVar16 = instr->m_dst;
  autoReuseAddResultOpnd._16_8_ = pLVar9;
  if (pOVar16 == (Opnd *)0x0) {
    local_60 = (Opnd *)0x0;
  }
  else {
    local_60 = IR::Instr::UnlinkDst(instr);
    OVar5 = IR::Opnd::GetKind(local_60);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
    if (local_60[1]._vptr_Opnd == (_func_int **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x35af,"(!offsetOpnd || offsetOpnd->GetValue() != 0)",
                         "!offsetOpnd || offsetOpnd->GetValue() != 0");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
  }
  OVar1 = instr->m_opcode;
  IR::Instr::Remove(instr);
  if (pOVar16 == (Opnd *)0x0) {
    left = (undefined1  [8])0x0;
  }
  else {
    left = (undefined1  [8])local_60[1]._vptr_Opnd;
  }
  func = (local_50->super_Instr).m_func;
  OVar5 = IR::Opnd::GetKind((Opnd *)local_40);
  local_32 = BrLe_A;
  bVar3 = 1;
  if (((OVar5 == OpndKindIntConst) &&
      (OVar5 = IR::Opnd::GetKind((Opnd *)pLVar10), left != (undefined1  [8])0xffffffff80000000)) &&
     (OVar5 == OpndKindReg)) {
    left = (undefined1  [8])-(long)left;
    local_32 = BrGe_A;
    bVar17 = 1;
    bVar3 = 0;
    pLVar11 = local_40;
    local_40 = pLVar10;
  }
  else {
    bVar17 = 0;
    pLVar11 = pLVar10;
  }
  pLVar10 = pLVar11;
  OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
  if (OVar5 == OpndKindIntConst) {
    OVar5 = IR::Opnd::GetKind((Opnd *)pLVar11);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar4) goto LAB_005bcf6e;
      *puVar8 = 0;
    }
    pLVar10 = (Lowerer *)left;
    bVar4 = IntConstMath::Add((IntConstType)left,(IntConstType)(pLVar11->m_lowererMD).m_func,TyInt32
                              ,(IntConstType *)local_80);
    if (!bVar4) {
      local_60 = (Opnd *)0x0;
      pLVar11 = (Lowerer *)0x0;
      left = local_80;
    }
  }
  target = autoReuseAddResultOpnd._16_8_;
  local_80 = (undefined1  [8])0x0;
  autoReuseAddResultOpnd.func._1_1_ = 1;
  if ((bool)(bVar3 & left == (undefined1  [8])&DAT_ffffffffffffffff)) {
    local_32 = BrLt_A;
  }
  else {
    if (!(bool)(bVar17 & left == (undefined1  [8])&DAT_00000001)) {
      if (pLVar11 != (Lowerer *)0x0 && left != (undefined1  [8])0x0) {
        local_50 = IR::Instr::GetOrCreateContinueLabel((local_50->super_Instr).m_prev,true);
        if ((local_60 != (Opnd *)0x0) && ((undefined1  [8])local_60[1]._vptr_Opnd != left)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x35e3,"(!offsetOpnd || offsetOpnd->GetValue() == offset)",
                             "!offsetOpnd || offsetOpnd->GetValue() == offset");
          if (!bVar4) {
LAB_005bcf6e:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        opnd = (Lowerer *)IR::RegOpnd::New(TyInt32,func);
        IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_80,(Opnd *)opnd,func,true);
        if (local_60 == (Opnd *)0x0) {
          pIVar12 = IR::IntConstOpnd::New((IntConstType)left,TyInt32,func,false);
        }
        else {
          pIVar12 = (IntConstOpnd *)IR::Opnd::UseWithNewType(local_60,TyInt32,func);
        }
        InsertAdd(true,(Opnd *)opnd,(Opnd *)pLVar11,&pIVar12->super_Opnd,&local_50->super_Instr);
        pLVar10 = (Lowerer *)0x42b;
        InsertBranch(JO,false,local_50,&local_50->super_Instr);
        pLVar11 = opnd;
      }
      goto LAB_005bcde3;
    }
    local_32 = BrGt_A;
  }
  left = (undefined1  [8])0x0;
LAB_005bcde3:
  if (pLVar11 == (Lowerer *)0x0) {
    pLVar11 = (Lowerer *)IR::IntConstOpnd::New((IntConstType)left,TyInt32,func,false);
    pLVar10 = (Lowerer *)left;
  }
  InsertCompareBranch(pLVar10,(Opnd *)local_40,(Opnd *)pLVar11,local_32,OVar1 == UnsignedBoundCheck,
                      (LabelInstr *)target,&local_50->super_Instr,false);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_80);
  return;
}

Assistant:

void Lowerer::LowerBoundCheck(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BoundCheck || instr->m_opcode == Js::OpCode::UnsignedBoundCheck);

#if DBG
    if(instr->m_opcode == Js::OpCode::UnsignedBoundCheck)
    {
        // UnsignedBoundCheck is currently only supported for the pattern:
        //     UnsignedBoundCheck s1 <= s2 + c, where c == 0 || c == -1
        Assert(instr->GetSrc1()->IsRegOpnd());
        Assert(instr->GetSrc1()->IsInt32());
        Assert(instr->GetSrc2());
        Assert(!instr->GetSrc2()->IsIntConstOpnd());
        if(instr->GetDst())
        {
            const int32 c = instr->GetDst()->AsIntConstOpnd()->AsInt32();
            Assert(c == 0 || c == -1);
        }
    }
#endif

    const IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    Assert(
        bailOutKind == IR::BailOutOnArrayAccessHelperCall ||
        bailOutKind == IR::BailOutOnInvalidatedArrayHeadSegment ||
        bailOutKind == IR::BailOutOnFailedHoistedBoundCheck ||
        bailOutKind == IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck);

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(false);
    LowerOneBailOutKind(instr, bailOutKind, false);
    Assert(!instr->HasBailOutInfo());
    IR::Instr *insertBeforeInstr = instr->m_next;

#if DBG
    const auto VerifyLeftOrRightOpnd = [&](IR::Opnd *const opnd, const bool isRightOpnd)
    {
        if(!opnd)
        {
            Assert(isRightOpnd);
            return;
        }
        if(opnd->IsIntConstOpnd())
        {
            Assert(!isRightOpnd || opnd->AsIntConstOpnd()->GetValue() != 0);
            return;
        }
        Assert(opnd->GetType() == TyInt32 || opnd->GetType() == TyUint32);
    };
#endif

    // left <= right + offset (src1 <= src2 + dst)
    IR::Opnd *leftOpnd = instr->UnlinkSrc1();
    DebugOnly(VerifyLeftOrRightOpnd(leftOpnd, false));
    IR::Opnd *rightOpnd = instr->UnlinkSrc2();
    DebugOnly(VerifyLeftOrRightOpnd(rightOpnd, true));
    Assert(!leftOpnd->IsIntConstOpnd() || rightOpnd && !rightOpnd->IsIntConstOpnd());
    IR::IntConstOpnd *offsetOpnd = instr->GetDst() ? instr->UnlinkDst()->AsIntConstOpnd() : nullptr;
    Assert(!offsetOpnd || offsetOpnd->GetValue() != 0);
    const bool doUnsignedCompare = instr->m_opcode == Js::OpCode::UnsignedBoundCheck;
    instr->Remove();

    Func *const func = insertBeforeInstr->m_func;

    IntConstType offset = offsetOpnd ? offsetOpnd->GetValue() : 0;
    Js::OpCode compareOpCode = Js::OpCode::BrLe_A;
    if(leftOpnd->IsIntConstOpnd() && rightOpnd->IsRegOpnd() && offset != IntConstMin)
    {
        // Put the constants together: swap the operands, negate the offset, and invert the branch
        IR::Opnd *const tempOpnd = leftOpnd;
        leftOpnd = rightOpnd;
        rightOpnd = tempOpnd;
        offset = -offset;
        compareOpCode = Js::OpCode::BrGe_A;
    }

    if(rightOpnd->IsIntConstOpnd())
    {
        // Try to aggregate right + offset into a constant offset
        IntConstType newOffset;
        if(!IntConstMath::Add(offset, rightOpnd->AsIntConstOpnd()->GetValue(), TyInt32, &newOffset))
        {
            offset = newOffset;
            rightOpnd = nullptr;
            offsetOpnd = nullptr;
        }
    }

    // Determine if the Add for (right + offset) is necessary, and the op code that will be used for the comparison
    IR::AutoReuseOpnd autoReuseAddResultOpnd;
    if(offset == -1 && compareOpCode == Js::OpCode::BrLe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrLt_A;
    }
    else if(offset == 1 && compareOpCode == Js::OpCode::BrGe_A)
    {
        offset = 0;
        compareOpCode = Js::OpCode::BrGt_A;
    }
    else if(offset != 0 && rightOpnd)
    {
        // Need to Add (right + offset). If it overflows, bail out.
        IR::LabelInstr *const bailOutLabel = insertBeforeInstr->m_prev->GetOrCreateContinueLabel(true);
        insertBeforeInstr = bailOutLabel;

        //     mov  temp, right
        //     add  temp, offset
        //     jo   $bailOut
        // $bailOut: (insertBeforeInstr)
        Assert(!offsetOpnd || offsetOpnd->GetValue() == offset);
        IR::RegOpnd *const addResultOpnd = IR::RegOpnd::New(TyInt32, func);
        autoReuseAddResultOpnd.Initialize(addResultOpnd, func);
        InsertAdd(
            true,
            addResultOpnd,
            rightOpnd,
            offsetOpnd ? offsetOpnd->UseWithNewType(TyInt32, func) : IR::IntConstOpnd::New(offset, TyInt32, func),
            insertBeforeInstr);
        InsertBranch(LowererMD::MDOverflowBranchOpcode, bailOutLabel, insertBeforeInstr);

        rightOpnd = addResultOpnd;
    }

    //     cmp  left, right
    //     jl[e] $skipBailOut
    // $bailOut:
    if(!rightOpnd)
    {
        rightOpnd = IR::IntConstOpnd::New(offset, TyInt32, func);
    }
    InsertCompareBranch(leftOpnd, rightOpnd, compareOpCode, doUnsignedCompare, skipBailOutLabel, insertBeforeInstr);
}